

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

transaction<pstore::lock_guard<pstore::transaction_mutex>_> *
pstore::begin(transaction<pstore::lock_guard<pstore::transaction_mutex>_> *__return_storage_ptr__,
             database *db)

{
  transaction_mutex local_60;
  lock_guard<pstore::transaction_mutex> local_40;
  database *local_18;
  database *db_local;
  
  local_18 = db;
  db_local = (database *)__return_storage_ptr__;
  transaction_mutex::transaction_mutex(&local_60,db);
  lock_guard<pstore::transaction_mutex>::lock_guard(&local_40,&local_60);
  begin(__return_storage_ptr__,db,&local_40);
  lock_guard<pstore::transaction_mutex>::~lock_guard(&local_40);
  transaction_mutex::~transaction_mutex(&local_60);
  return __return_storage_ptr__;
}

Assistant:

transaction<transaction_lock> begin (database & db) {
        return begin (db, transaction_lock{transaction_mutex{db}});
    }